

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O3

char * utostr(uint64_t X,_Bool isNeg)

{
  bool bVar1;
  char *pcVar2;
  byte *str;
  char Buffer [22];
  byte local_4 [4];
  
  local_4[1] = 0;
  if (X == 0) {
    str = local_4;
    local_4[0] = 0x30;
  }
  else {
    str = local_4 + 1;
    do {
      str[-1] = (char)X + (char)(X / 10) * -10 | 0x30;
      str = str + -1;
      bVar1 = 9 < X;
      X = X / 10;
    } while (bVar1);
  }
  pcVar2 = cs_strdup((char *)str);
  return pcVar2;
}

Assistant:

static char *utostr(uint64_t X, bool isNeg)
{
	char Buffer[22];
	char *BufPtr = Buffer+21;
	char *result;

	Buffer[21] = '\0';
	if (X == 0) *--BufPtr = '0';  // Handle special case...

	while (X) {
		*--BufPtr = X % 10 + '0';
		X /= 10;
	}

	if (isNeg) *--BufPtr = '-';   // Add negative sign...

	result = cs_strdup(BufPtr);
	return result;
}